

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_fragment_shading_rate
          (Impl *this,Value *state,VkPipelineFragmentShadingRateStateCreateInfoKHR **out_info)

{
  bool bVar1;
  uint uVar2;
  VkFragmentShadingRateCombinerOpKHR VVar3;
  VkPipelineFragmentShadingRateStateCreateInfoKHR *pVVar4;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar5;
  Type pGVar6;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  uint local_2c;
  uint32_t i;
  VkPipelineFragmentShadingRateStateCreateInfoKHR *info;
  VkPipelineFragmentShadingRateStateCreateInfoKHR **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar4 = ScratchAllocator::allocate_cleared<VkPipelineFragmentShadingRateStateCreateInfoKHR>
                     (&this->allocator);
  *out_info = pVVar4;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(state,"fragmentSize");
  if (bVar1) {
    pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)state,"fragmentSize");
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(pGVar5,"width");
    uVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar6);
    (pVVar4->fragmentSize).width = uVar2;
    pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)state,"fragmentSize");
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>(pGVar5,"height");
    uVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar6);
    (pVVar4->fragmentSize).height = uVar2;
  }
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(state,"combinerOps");
  if (bVar1) {
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)state,"combinerOps");
      this_00 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::operator[](pGVar6,local_2c);
      VVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetUint(this_00);
      pVVar4->combinerOps[local_2c] = VVar3;
    }
  }
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_fragment_shading_rate(const Value &state,
                                                      VkPipelineFragmentShadingRateStateCreateInfoKHR **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineFragmentShadingRateStateCreateInfoKHR>();
	*out_info = info;

	// Could be null for dynamic state.
	if (state.HasMember("fragmentSize"))
	{
		info->fragmentSize.width = state["fragmentSize"]["width"].GetUint();
		info->fragmentSize.height = state["fragmentSize"]["height"].GetUint();
	}

	// Could be null for dynamic state.
	if (state.HasMember("combinerOps"))
	{
		for (uint32_t i = 0; i < 2; i++)
			info->combinerOps[i] = static_cast<VkFragmentShadingRateCombinerOpKHR>(state["combinerOps"][i].GetUint());
	}

	return true;
}